

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlCatalogSetDefaults(xmlCatalogAllow allow)

{
  xmlCatalogAllow allow_local;
  
  if (xmlDebugCatalogs != 0) {
    switch(allow) {
    case XML_CATA_ALLOW_NONE:
      xmlCatalogPrintDebug("Disabling catalog usage\n");
      break;
    case XML_CATA_ALLOW_GLOBAL:
      xmlCatalogPrintDebug("Allowing only global catalogs\n");
      break;
    case XML_CATA_ALLOW_DOCUMENT:
      xmlCatalogPrintDebug("Allowing only catalogs from the document\n");
      break;
    case XML_CATA_ALLOW_ALL:
      xmlCatalogPrintDebug("Allowing all catalogs\n");
    }
  }
  xmlCatalogDefaultAllow = allow;
  return;
}

Assistant:

void
xmlCatalogSetDefaults(xmlCatalogAllow allow) {
    if (xmlDebugCatalogs) {
	switch (allow) {
	    case XML_CATA_ALLOW_NONE:
		xmlCatalogPrintDebug(
			"Disabling catalog usage\n");
		break;
	    case XML_CATA_ALLOW_GLOBAL:
		xmlCatalogPrintDebug(
			"Allowing only global catalogs\n");
		break;
	    case XML_CATA_ALLOW_DOCUMENT:
		xmlCatalogPrintDebug(
			"Allowing only catalogs from the document\n");
		break;
	    case XML_CATA_ALLOW_ALL:
		xmlCatalogPrintDebug(
			"Allowing all catalogs\n");
		break;
	}
    }
    xmlCatalogDefaultAllow = allow;
}